

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          string *substr)

{
  TestPartResultArray *this;
  int iVar1;
  TestPartResult *pTVar2;
  AssertionResult *pAVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  char *pcVar5;
  undefined4 in_register_00000084;
  Type TVar6;
  int index;
  AssertionResult AVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  undefined1 local_68 [8];
  string expected;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Message msg;
  
  TVar6 = (Type)substr;
  this = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar5 = "1 non-fatal failure";
  if (TVar6 == kFatalFailure) {
    pcVar5 = "1 fatal failure";
  }
  local_68 = (undefined1  [8])&expected._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,pcVar5,pcVar5 + (ulong)(TVar6 != kFatalFailure) * 4 + 0xf);
  Message::Message((Message *)&local_38);
  if ((int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 4) * -0x49249249 == 1) {
    pTVar2 = TestPartResultArray::GetTestPartResult(this,0);
    if (pTVar2->type_ == TVar6) {
      pcVar5 = strstr((pTVar2->message_)._M_dataplus._M_p,(in_stack_00000008->_M_dataplus)._M_p);
      if (pcVar5 != (char *)0x0) {
        *param_1 = '\x01';
        param_1[8] = '\0';
        param_1[9] = '\0';
        param_1[10] = '\0';
        param_1[0xb] = '\0';
        param_1[0xc] = '\0';
        param_1[0xd] = '\0';
        param_1[0xe] = '\0';
        param_1[0xf] = '\0';
        sVar4.ptr_ = extraout_RDX;
        goto LAB_0012715b;
      }
      expected.field_2._M_local_buf[8] = '\0';
      local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar3 = AssertionResult::operator<<
                         ((AssertionResult *)((long)&expected.field_2 + 8),(char (*) [11])0x1499f6);
      pAVar3 = AssertionResult::operator<<
                         (pAVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_68);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [14])" containing \"");
      pAVar3 = AssertionResult::operator<<(pAVar3,in_stack_00000008);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x14a1a2);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar2);
      AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar3);
    }
    else {
      expected.field_2._M_local_buf[8] = '\0';
      local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar3 = AssertionResult::operator<<
                         ((AssertionResult *)((long)&expected.field_2 + 8),(char (*) [11])0x1499f6);
      pAVar3 = AssertionResult::operator<<
                         (pAVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_68);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x14a0e9);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar2);
      AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar3);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38.ptr_ + 0x10),"Expected: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38.ptr_ + 0x10),(char *)local_68,(long)expected._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_38.ptr_ + 0x10),"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38.ptr_ + 0x10),"  Actual: ",10);
    std::ostream::operator<<
              ((ostream *)(local_38.ptr_ + 0x10),
               (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 4) * -0x49249249);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38.ptr_ + 0x10)," failures",9);
    if (0 < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 4) * -0x49249249) {
      index = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_38.ptr_ + 0x10),"\n",1)
        ;
        pTVar2 = TestPartResultArray::GetTestPartResult(this,index);
        testing::operator<<((ostream *)(local_38.ptr_ + 0x10),pTVar2);
        index = index + 1;
        iVar1 = (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 4);
      } while (SBORROW4(index,iVar1 * -0x49249249) != index + iVar1 * 0x49249249 < 0);
    }
    expected.field_2._M_local_buf[8] = '\0';
    local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar3 = AssertionResult::operator<<
                       ((AssertionResult *)((long)&expected.field_2 + 8),(Message *)&local_38);
    AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar3);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&stack0xffffffffffffffc0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar4.ptr_ = extraout_RDX_00;
LAB_0012715b:
  if (local_38.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_38.ptr_ + 8))();
    local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar4.ptr_ = extraout_RDX_01;
  }
  if (local_68 != (undefined1  [8])&expected._M_string_length) {
    operator_delete((void *)local_68,expected._M_string_length + 1);
    sVar4.ptr_ = extraout_RDX_02;
  }
  AVar7.message_.ptr_ = sVar4.ptr_;
  AVar7._0_8_ = param_1;
  return AVar7;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const string& substr) {
  const std::string expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure() << msg;
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    return AssertionFailure() << "Expected: " << expected << "\n"
                              << "  Actual:\n"
                              << r;
  }

  if (strstr(r.message(), substr.c_str()) == NULL) {
    return AssertionFailure() << "Expected: " << expected << " containing \""
                              << substr << "\"\n"
                              << "  Actual:\n"
                              << r;
  }

  return AssertionSuccess();
}